

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte_filter_pusher.cpp
# Opt level: O1

void __thiscall duckdb::CTEFilterPusher::FindCandidates(CTEFilterPusher *this,LogicalOperator *op)

{
  pointer *pprVar1;
  ulong uVar2;
  pointer prVar3;
  pointer puVar4;
  iterator __position;
  bool bVar5;
  _Head_base<0UL,_duckdb::CTEFilterPusher::MaterializedCTEInfo_*,_false> _Var6;
  char cVar7;
  LogicalMaterializedCTE *pLVar8;
  reference pvVar9;
  pointer pLVar10;
  LogicalCTERef *pLVar11;
  MaterializedCTEInfo *this_00;
  type op_00;
  iterator iVar12;
  pointer pMVar13;
  ulong uVar14;
  char cVar15;
  pointer ppVar16;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *child;
  pointer this_01;
  templated_unique_single_t value;
  string key;
  _Head_base<0UL,_duckdb::CTEFilterPusher::MaterializedCTEInfo_*,_false> local_50;
  undefined1 local_48 [32];
  
  if (op->type == LOGICAL_FILTER) {
    pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](&op->children,0);
    pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->(pvVar9);
    if (pLVar10->type == LOGICAL_CTE_REF) {
      pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](&op->children,0);
      pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->(pvVar9);
      pLVar11 = LogicalOperator::Cast<duckdb::LogicalCTERef>(pLVar10);
      uVar2 = pLVar11->cte_index;
      cVar15 = '\x01';
      if (9 < uVar2) {
        uVar14 = uVar2;
        cVar7 = '\x04';
        do {
          cVar15 = cVar7;
          if (uVar14 < 100) {
            cVar15 = cVar15 + -2;
            goto LAB_0117e23a;
          }
          if (uVar14 < 1000) {
            cVar15 = cVar15 + -1;
            goto LAB_0117e23a;
          }
          if (uVar14 < 10000) goto LAB_0117e23a;
          bVar5 = 99999 < uVar14;
          uVar14 = uVar14 / 10000;
          cVar7 = cVar15 + '\x04';
        } while (bVar5);
        cVar15 = cVar15 + '\x01';
      }
LAB_0117e23a:
      local_48._0_8_ = (LogicalOperator *)(local_48 + 0x10);
      ::std::__cxx11::string::_M_construct((ulong)local_48,cVar15);
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_48._0_8_,local_48._8_4_,uVar2);
      iVar12 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&(this->cte_info_map).map_idx,(key_type *)local_48);
      if (iVar12.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
          ._M_cur == (__node_type *)0x0) {
        ppVar16 = (this->cte_info_map).map.
                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
                  .
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        ppVar16 = (this->cte_info_map).map.
                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
                  .
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                  *(long *)((long)iVar12.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                  ._M_cur + 0x28);
      }
      if ((LogicalOperator *)local_48._0_8_ != (LogicalOperator *)(local_48 + 0x10)) {
        operator_delete((void *)local_48._0_8_);
      }
      if (ppVar16 ==
          (this->cte_info_map).map.
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
          .
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        return;
      }
      pMVar13 = unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>
                ::operator->(&ppVar16->second);
      __position._M_current =
           (pMVar13->filters).
           super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (pMVar13->filters).
          super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        (__position._M_current)->_M_data = op;
        pprVar1 = &(pMVar13->filters).
                   super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pprVar1 = *pprVar1 + 1;
        return;
      }
      local_48._0_8_ = op;
      ::std::
      vector<std::reference_wrapper<duckdb::LogicalOperator>,std::allocator<std::reference_wrapper<duckdb::LogicalOperator>>>
      ::_M_realloc_insert<std::reference_wrapper<duckdb::LogicalOperator>>
                ((vector<std::reference_wrapper<duckdb::LogicalOperator>,std::allocator<std::reference_wrapper<duckdb::LogicalOperator>>>
                  *)&pMVar13->filters,__position,
                 (reference_wrapper<duckdb::LogicalOperator> *)local_48);
      return;
    }
  }
  else if (op->type == LOGICAL_MATERIALIZED_CTE) {
    pLVar8 = LogicalOperator::Cast<duckdb::LogicalMaterializedCTE>(op);
    uVar2 = pLVar8->table_index;
    cVar15 = '\x01';
    if (9 < uVar2) {
      uVar14 = uVar2;
      cVar7 = '\x04';
      do {
        cVar15 = cVar7;
        if (uVar14 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_0117e0fb;
        }
        if (uVar14 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_0117e0fb;
        }
        if (uVar14 < 10000) goto LAB_0117e0fb;
        bVar5 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        cVar7 = cVar15 + '\x04';
      } while (bVar5);
      cVar15 = cVar15 + '\x01';
    }
LAB_0117e0fb:
    local_48._0_8_ = (LogicalOperator *)(local_48 + 0x10);
    ::std::__cxx11::string::_M_construct((ulong)local_48,cVar15);
    ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_48._0_8_,local_48._8_4_,uVar2);
    this_00 = (MaterializedCTEInfo *)operator_new(0x28);
    MaterializedCTEInfo::MaterializedCTEInfo(this_00,op);
    local_50._M_head_impl = this_00;
    InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
    ::insert(&this->cte_info_map,(string *)local_48,
             (unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>
              *)&local_50);
    _Var6._M_head_impl = local_50._M_head_impl;
    if (local_50._M_head_impl != (MaterializedCTEInfo *)0x0) {
      prVar3 = ((local_50._M_head_impl)->filters).
               super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (prVar3 != (pointer)0x0) {
        operator_delete(prVar3);
      }
      operator_delete(_Var6._M_head_impl);
    }
    if ((LogicalOperator *)local_48._0_8_ != (LogicalOperator *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_);
    }
    goto LAB_0117e183;
  }
  if (op->type == LOGICAL_CTE_REF) {
    pLVar11 = LogicalOperator::Cast<duckdb::LogicalCTERef>(op);
    uVar2 = pLVar11->cte_index;
    cVar15 = '\x01';
    if (9 < uVar2) {
      uVar14 = uVar2;
      cVar7 = '\x04';
      do {
        cVar15 = cVar7;
        if (uVar14 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_0117e1b4;
        }
        if (uVar14 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_0117e1b4;
        }
        if (uVar14 < 10000) goto LAB_0117e1b4;
        bVar5 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        cVar7 = cVar15 + '\x04';
      } while (bVar5);
      cVar15 = cVar15 + '\x01';
    }
LAB_0117e1b4:
    local_48._0_8_ = (LogicalOperator *)(local_48 + 0x10);
    ::std::__cxx11::string::_M_construct((ulong)local_48,cVar15);
    ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_48._0_8_,local_48._8_4_,uVar2);
    iVar12 = ::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&(this->cte_info_map).map_idx,(key_type *)local_48);
    if (iVar12.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      ppVar16 = (this->cte_info_map).map.
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
                .
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      ppVar16 = (this->cte_info_map).map.
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
                .
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start +
                *(long *)((long)iVar12.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                ._M_cur + 0x28);
    }
    if ((LogicalOperator *)local_48._0_8_ != (LogicalOperator *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_);
    }
    if (ppVar16 ==
        (this->cte_info_map).map.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    pMVar13 = unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>
              ::operator->(&ppVar16->second);
    pMVar13->all_cte_refs_are_filtered = false;
    return;
  }
LAB_0117e183:
  puVar4 = (op->children).
           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (op->children).
                 super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar4; this_01 = this_01 + 1
      ) {
    op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(this_01);
    FindCandidates(this,op_00);
  }
  return;
}

Assistant:

void CTEFilterPusher::FindCandidates(LogicalOperator &op) {
	if (op.type == LogicalOperatorType::LOGICAL_MATERIALIZED_CTE) {
		// We encountered a new CTE, add it to the map
		auto key = to_string(op.Cast<LogicalMaterializedCTE>().table_index);
		auto value = make_uniq<MaterializedCTEInfo>(op);

		cte_info_map.insert(key, std::move(value));
	} else if (op.type == LogicalOperatorType::LOGICAL_FILTER &&
	           op.children[0]->type == LogicalOperatorType::LOGICAL_CTE_REF) {
		// We encountered a filtered CTE ref, update the according CTE info
		auto &cte_ref = op.children[0]->Cast<LogicalCTERef>();
		auto it = cte_info_map.find(to_string(cte_ref.cte_index));
		if (it != cte_info_map.end()) {
			it->second->filters.push_back(op);
		}
		return;
	} else if (op.type == LogicalOperatorType::LOGICAL_CTE_REF) {
		// We encountered a CTE ref without a filter on top, so we can't do the optimization
		auto &cte_ref = op.Cast<LogicalCTERef>();
		auto it = cte_info_map.find(to_string(cte_ref.cte_index));
		if (it != cte_info_map.end()) {
			it->second->all_cte_refs_are_filtered = false;
		}
		return;
	}
	for (auto &child : op.children) {
		FindCandidates(*child);
	}
}